

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Recorder.cpp
# Opt level: O3

void __thiscall
chrono::ChFunction_Recorder::ArchiveIN(ChFunction_Recorder *this,ChArchiveIn *marchive)

{
  vector<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_> tmpvect;
  vector<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_> local_48;
  ChNameValue<std::vector<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>_> local_28;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_Recorder>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_48.super__Vector_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28._name = "tmpvect";
  local_48.super__Vector_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (ChRecPoint *)0x0;
  local_48.super__Vector_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (ChRecPoint *)0x0;
  local_28._flags = '\0';
  local_28._value = &local_48;
  ChArchiveIn::in<chrono::ChRecPoint>(marchive,&local_28);
  std::__cxx11::list<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>::clear
            (&this->m_points);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<chrono::ChRecPoint*,std::back_insert_iterator<std::__cxx11::list<chrono::ChRecPoint,std::allocator<chrono::ChRecPoint>>>>
            (local_48.super__Vector_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>.
             _M_impl.super__Vector_impl_data._M_start,
             local_48.super__Vector_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (back_insert_iterator<std::__cxx11::list<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>_>
              )&this->m_points);
  if (local_48.super__Vector_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (ChRecPoint *)0x0) {
    operator_delete(local_48.
                    super__Vector_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ChFunction_Recorder::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_Recorder>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data: load vector of points and copy to list
    std::vector<ChRecPoint> tmpvect;
    marchive >> CHNVP(tmpvect);
    m_points.clear();
    std::copy(tmpvect.begin(), tmpvect.end(), std::back_inserter(m_points));
}